

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::TSPI_PDU(TSPI_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  TSPI_PDU *this_local;
  
  LE_Header::LE_Header(&this->super_LE_Header,H);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__TSPI_PDU_0032bc40;
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_Loc);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_LinVel);
  DATA_TYPE::LE_EulerAngles::LE_EulerAngles(&this->m_Ori);
  DATA_TYPE::PositionError::PositionError(&this->m_PosErr);
  DATA_TYPE::OrientationError::OrientationError(&this->m_OriErr);
  DATA_TYPE::LE_DeadReckoningParameter::LE_DeadReckoningParameter(&this->m_DeadReckoningParameter);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&this->m_MeasureSpd);
  this->m_ui8SSDLen = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vSSD);
  (*(this->super_LE_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

TSPI_PDU::TSPI_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    LE_Header( H ),
    m_ui8SSDLen( 0 )
{
    Decode( stream, true );
}